

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 674_longestContIncSubseq.cpp
# Opt level: O0

int main(void)

{
  initializer_list<int> __l;
  int iVar1;
  ostream *this;
  allocator<int> local_41;
  int local_40 [4];
  iterator local_30;
  size_type local_28;
  undefined1 local_20 [8];
  vector<int,_std::allocator<int>_> v;
  
  local_40[0] = 1;
  local_40[1] = 3;
  local_40[2] = 5;
  local_40[3] = 7;
  local_30 = local_40;
  local_28 = 4;
  std::allocator<int>::allocator(&local_41);
  __l._M_len = local_28;
  __l._M_array = local_30;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_20,__l,&local_41);
  std::allocator<int>::~allocator(&local_41);
  iVar1 = findLengthOfLCIS((vector<int,_std::allocator<int>_> *)local_20);
  this = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_20);
  return 0;
}

Assistant:

int main()
{
	vector<int> v={1,3,5,7};
	cout<<findLengthOfLCIS(v)<<endl;
}